

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall DLevelScript::Serialize(DLevelScript *this,FArchive *arc)

{
  FBehavior *pFVar1;
  FArchive *pFVar2;
  SDWORD *pSVar3;
  ulong uVar4;
  BYTE val;
  WORD lib_1;
  WORD lib;
  DWORD local_2c;
  undefined1 local_25;
  ushort local_24;
  WORD local_22;
  
  DObject::Serialize(&this->super_DObject,arc);
  P_SerializeACSScriptNumber(arc,&this->script,false);
  local_25 = (undefined1)this->state;
  FArchive::operator<<(arc,&local_25);
  this->state = (uint)(byte)local_25;
  pFVar2 = FArchive::operator<<(arc,(DWORD *)&this->statedata);
  pFVar2 = FArchive::SerializeObject
                     (pFVar2,(DObject **)&this->activator,AActor::RegistrationInfo.MyClass);
  pFVar2 = ::operator<<(pFVar2,&this->activationline);
  pFVar2 = FArchive::operator<<(pFVar2,&this->backSide);
  FArchive::operator<<(pFVar2,(DWORD *)&this->numlocalvars);
  if (arc->m_Loading == true) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)this->numlocalvars) {
      uVar4 = (long)this->numlocalvars * 4;
    }
    pSVar3 = (SDWORD *)operator_new__(uVar4);
    this->localvars = pSVar3;
  }
  local_2c = 0;
  if (this->numlocalvars != 0) {
    do {
      FArchive::operator<<(arc,(DWORD *)(this->localvars + local_2c));
      local_2c = local_2c + 1;
    } while (local_2c < (uint)this->numlocalvars);
  }
  if (arc->m_Storing == true) {
    local_22 = (WORD)((int)this->activeBehavior->LibraryID >> 0x14);
    FArchive::operator<<(arc,&local_22);
    local_2c = *(int *)&this->pc - *(int *)&this->activeBehavior->Data;
    FArchive::operator<<(arc,&local_2c);
  }
  else {
    pFVar2 = FArchive::operator<<(arc,&local_24);
    FArchive::operator<<(pFVar2,&local_2c);
    pFVar1 = FBehavior::StaticModules.Array[local_24];
    this->activeBehavior = pFVar1;
    this->pc = (int *)(pFVar1->Data + local_2c);
  }
  pFVar2 = SerializeFFontPtr(arc,&this->activefont);
  pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&this->hudwidth);
  FArchive::operator<<(pFVar2,(DWORD *)&this->hudheight);
  pFVar2 = FArchive::operator<<(arc,(DWORD *)&this->ClipRectLeft);
  pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&this->ClipRectTop);
  pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&this->ClipRectWidth);
  pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&this->ClipRectHeight);
  FArchive::operator<<(pFVar2,(DWORD *)&this->WrapWidth);
  FArchive::operator<<(arc,(DWORD *)&this->InModuleScriptNumber);
  return;
}

Assistant:

void DLevelScript::Serialize (FArchive &arc)
{
	DWORD i;

	Super::Serialize (arc);

	P_SerializeACSScriptNumber(arc, script, false);

	arc	<< state
		<< statedata
		<< activator
		<< activationline
		<< backSide
		<< numlocalvars;

	if (arc.IsLoading())
	{
		localvars = new SDWORD[numlocalvars];
	}
	for (i = 0; i < (DWORD)numlocalvars; i++)
	{
		arc << localvars[i];
	}

	if (arc.IsStoring ())
	{
		WORD lib = activeBehavior->GetLibraryID() >> LIBRARYID_SHIFT;
		arc << lib;
		i = activeBehavior->PC2Ofs (pc);
		arc << i;
	}
	else
	{
		WORD lib;
		arc << lib << i;
		activeBehavior = FBehavior::StaticGetModule (lib);
		pc = activeBehavior->Ofs2PC (i);
	}

	arc << activefont
		<< hudwidth << hudheight;
	arc << ClipRectLeft << ClipRectTop << ClipRectWidth << ClipRectHeight
		<< WrapWidth;
	arc << InModuleScriptNumber;
}